

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTestCase.cpp
# Opt level: O0

void __thiscall
SuiteUtilityTests::TestfileExists_FileDoesNotExist::RunImpl(TestfileExists_FileDoesNotExist *this)

{
  TestResults *this_00;
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  TestDetails local_68;
  allocator<char> local_31;
  string local_30 [8];
  string unknownFile;
  TestfileExists_FileDoesNotExist *this_local;
  
  unknownFile.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"unknownfile.txt",&local_31);
  std::allocator<char>::~allocator(&local_31);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = FIX::file_exists(pcVar3);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar1 & 1));
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_68,*ppTVar5,0xc4);
    UnitTest::TestResults::OnTestFailure(this_00,&local_68,"!file_exists(unknownFile.c_str())");
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(fileExists_FileDoesNotExist)
{
  std::string unknownFile = "unknownfile.txt";
  CHECK(!file_exists(unknownFile.c_str()));
}